

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O1

int __thiscall
GEO::geofile::adjust_points
          (geofile *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *changes)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Self __tmp_1;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_color _Var9;
  _Rb_tree_color _Var10;
  _Rb_tree_header *p_Var11;
  iterator vector_it_end;
  _Self __tmp;
  node_type nodeHandler;
  node_type local_70;
  insert_return_type local_58;
  
  p_Var1 = &(changes->_M_t)._M_impl.super__Rb_tree_header;
  p_Var7 = (changes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      std::
      _Rb_tree<int,_std::pair<const_int,_GEO::point>,_std::_Select1st<std::pair<const_int,_GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
      ::extract(&local_70,&(this->points_map)._M_t,(key_type *)(p_Var7 + 1));
      if (local_70.
          super__Node_handle_common<std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>
          ._M_ptr != (pointer)0x0) {
        *local_70._M_pkey = *(int *)&p_Var7[1].field_0x4;
        std::
        _Rb_tree<int,_std::pair<const_int,_GEO::point>,_std::_Select1st<std::pair<const_int,_GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
        ::_M_reinsert_node_unique(&local_58,&(this->points_map)._M_t,&local_70);
        if (local_58.node.
            super__Node_handle_common<std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>
            ._M_ptr != (pointer)0x0) {
          operator_delete(local_58.node.
                          super__Node_handle_common<std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>
                          ._M_ptr,0x48);
          local_58.node.
          super__Node_handle_common<std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>
          ._M_ptr = (pointer)0x0;
        }
      }
      if (local_70.
          super__Node_handle_common<std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>
          ._M_ptr != (pointer)0x0) {
        operator_delete(local_70.
                        super__Node_handle_common<std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>
                        ._M_ptr,0x48);
        local_70.
        super__Node_handle_common<std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>
        ._M_ptr = (pointer)0x0;
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  p_Var11 = &(this->lines_map)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = (this->lines_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var7 != p_Var11) {
    p_Var3 = (changes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if ((_Rb_tree_header *)p_Var3 != p_Var1) {
        _Var10 = *(_Rb_tree_color *)&p_Var7[1].field_0x4;
        _Var9 = *(_Rb_tree_color *)&p_Var7[1]._M_parent;
        p_Var8 = p_Var3;
        do {
          _Var2 = p_Var8[1]._M_color;
          if (_Var10 == _Var2) {
            _Var10 = *(_Rb_tree_color *)&p_Var8[1].field_0x4;
            *(_Rb_tree_color *)&p_Var7[1].field_0x4 = _Var10;
          }
          if (_Var9 == _Var2) {
            _Var9 = *(_Rb_tree_color *)&p_Var8[1].field_0x4;
            *(_Rb_tree_color *)&p_Var7[1]._M_parent = _Var9;
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != p_Var1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var11);
  }
  p_Var7 = (this->physical_points_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(this->physical_points_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var11) {
    p_Var3 = (changes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if ((_Rb_tree_header *)p_Var3 != p_Var1) {
        p_Var4 = *(_Base_ptr *)(p_Var7 + 2);
        p_Var5 = p_Var7[2]._M_parent;
        p_Var6 = p_Var4;
        p_Var8 = p_Var3;
        do {
          for (; p_Var6 != p_Var5; p_Var6 = (_Base_ptr)&p_Var6->field_0x4) {
            if (p_Var6->_M_color == p_Var8[1]._M_color) {
              p_Var6->_M_color = *(_Rb_tree_color *)&p_Var8[1].field_0x4;
            }
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
          p_Var6 = p_Var4;
        } while ((_Rb_tree_header *)p_Var8 != p_Var1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var11);
  }
  return 0;
}

Assistant:

int GEO::geofile::adjust_points(std::map<int,int> changes)
{
    auto change_end = changes.end();
    for (auto i = changes.begin(); i != change_end; i++)
    {
        auto nodeHandler = points_map.extract(i->first);
        if(!nodeHandler.empty())
            {
                nodeHandler.key() = i->second;
                points_map.insert(std::move(nodeHandler));
            }
    }
    // Adjust dependencies to mirror the changes.
    //Lines
    auto l_m_end  = lines_map.end();
    for (auto l_it = lines_map.begin(); l_it != l_m_end; l_it++)
    {
        for (auto i = changes.begin(); i != change_end; i++)
        {
            if (l_it->second.start == i->first)
                l_it->second.start = i->second;
            if (l_it->second.end == i->first)
                l_it->second.end = i->second;
        }
    }
    //Physical points
    auto phys_p_end = physical_points_map.end();
    for (auto phys_p_it = physical_points_map.begin(); phys_p_it != phys_p_end; phys_p_it++)
    {
        for (auto i = changes.begin(); i != change_end; i++)
        {
            auto vector_it_end = phys_p_it->second.end();
            for (auto vector_it = phys_p_it->second.begin(); vector_it != vector_it_end; vector_it++)
            {
                if(*vector_it==i->first)
                    *vector_it=i->second;
            }
        }
    }
    return EXIT_SUCCESS;
}